

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_search.hpp
# Opt level: O3

int * burst::detail::galloping_search<int_const*,int,std::greater<void>>
                (int *first,int *last,int *value)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 local_19;
  
  piVar3 = std::
           __find_if<int_const*,__gnu_cxx::__ops::_Iter_negate<burst::detail::galloping_search<int_const*,int,std::greater<void>>(int_const*,int_const*,int_const&,std::greater<void>)::_lambda(auto:1_const&)_1_>>
                     ();
  if ((piVar3 != last) &&
     (piVar3 = std::
               __find_if<int_const*,__gnu_cxx::__ops::_Iter_pred<burst::detail::galloping_search<int_const*,int,std::greater<void>>(int_const*,int_const*,int_const&,std::greater<void>)::_lambda(auto:1_const&)_1_>>
                         (piVar3 + 1,last,value,&local_19), piVar3 != last)) {
    __assert_fail("std::is_partitioned(first, last, [& value, & compare] (const auto & e) {return compare(e, value);})"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/detail/galloping_search.hpp"
                  ,0x16,
                  "RandomAccessIterator burst::detail::galloping_search(RandomAccessIterator, RandomAccessIterator, const Value &, Compare) [RandomAccessIterator = const int *, Value = int, Compare = std::greater<void>]"
                 );
  }
  lVar4 = (long)last - (long)first;
  iVar2 = *value;
  uVar6 = 1;
  lVar7 = 0;
  do {
    if (lVar4 >> 2 <= (long)(uVar6 + lVar7)) {
      uVar6 = (long)last - (long)first >> 2;
      while (0 < (long)uVar6) {
        uVar5 = uVar6 >> 1;
        uVar8 = ~uVar5 + uVar6;
        uVar6 = uVar5;
        if (iVar2 < first[uVar5]) {
          uVar6 = uVar8;
          first = first + uVar5 + 1;
        }
      }
      return first;
    }
    piVar1 = first + uVar6;
    if (iVar2 < *piVar1) {
      first = first + uVar6 + 1;
      lVar7 = uVar6 + lVar7 + 1;
      uVar6 = uVar6 * 2;
    }
    else {
      piVar3 = first;
      uVar5 = uVar6;
      if ((long)uVar6 < 1) {
        return first;
      }
      do {
        uVar8 = uVar5 >> 1;
        if (iVar2 < piVar3[uVar8]) {
          piVar3 = piVar3 + uVar8 + 1;
          uVar8 = ~uVar8 + uVar5;
        }
        uVar5 = uVar8;
      } while (0 < (long)uVar8);
    }
  } while (iVar2 < *piVar1);
  return piVar3;
}

Assistant:

RandomAccessIterator
            galloping_search
            (
                RandomAccessIterator first, RandomAccessIterator last,
                const Value & value,
                Compare compare
            )
        {
            assert(std::is_partitioned(first, last,
                [& value, & compare] (const auto & e) {return compare(e, value);}));

            const auto distance = std::distance(first, last);

            auto position = static_cast<decltype(distance)>(0);
            auto step = static_cast<decltype(distance)>(1);

            while (position + step < distance)
            {
                const auto current = std::next(first, step);
                if (compare(*current, value))
                {
                    first = std::next(current);
                    position += step + 1;
                    step *= 2;
                }
                else
                {
                    return std::lower_bound(first, current, value, compare);
                }
            }

            return std::lower_bound(first, last, value, compare);
        }